

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O3

void si9ma::BinaryTree::print_tree(TreeNode *head)

{
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Binary Tree",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"H","");
  print_in_order(head,0,0x11,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void BinaryTree::print_tree(const TreeNode *head) {
        cout << "Binary Tree" << endl;
        print_in_order(head,0,17,"H");
        cout << endl;
    }